

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void finalize_regressor(vw *all,string *reg_name)

{
  string *reg_name_00;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (all->early_terminate == false) {
    if ((all->per_feature_regularizer_output)._M_string_length == 0) {
      reg_name_00 = &local_50;
      std::__cxx11::string::string((string *)reg_name_00,(string *)reg_name);
      dump_regressor(all,reg_name_00,false);
    }
    else {
      reg_name_00 = &local_30;
      std::__cxx11::string::string
                ((string *)reg_name_00,(string *)&all->per_feature_regularizer_output);
      dump_regressor(all,reg_name_00,false);
    }
    std::__cxx11::string::~string((string *)reg_name_00);
    if ((all->per_feature_regularizer_text)._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_90,(string *)&all->text_regressor_name);
      dump_regressor(all,&local_90,true);
      std::__cxx11::string::~string((string *)&local_90);
      all->print_invert = true;
      std::__cxx11::string::string((string *)&local_b0,(string *)&all->inv_hash_regressor_name);
      dump_regressor(all,&local_b0,true);
      std::__cxx11::string::~string((string *)&local_b0);
      all->print_invert = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&all->per_feature_regularizer_text)
      ;
      dump_regressor(all,&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void finalize_regressor(vw& all, string reg_name)
{
  if (!all.early_terminate)
  {
    if (all.per_feature_regularizer_output.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_output, false);
    else
      dump_regressor(all, reg_name, false);
    if (all.per_feature_regularizer_text.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_text, true);
    else
    {
      dump_regressor(all, all.text_regressor_name, true);
      all.print_invert = true;
      dump_regressor(all, all.inv_hash_regressor_name, true);
      all.print_invert = false;
    }
  }
}